

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O2

double MatDet(double *A,int row)

{
  int *list;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  list = (int *)malloc((long)row * 4);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < row) {
    uVar2 = (ulong)(uint)row;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    list[uVar1] = (int)uVar1;
  }
  dVar3 = det(A,row,0,list,0.0);
  free(list);
  return dVar3;
}

Assistant:

double MatDet(double *A, int row) {
    int *list = (int *) malloc(sizeof(int) * row);
    for (int i = 0; i < row; i++)
        list[i] = i;
    double Out = det(A, row, 0, list, 0.0);
    free(list);
    return Out;
}